

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O2

string * player_not_found_message_abi_cxx11_(string *__return_storage_ptr__,string_view name)

{
  string_view name_local;
  
  name_local._M_str = name._M_str;
  name_local._M_len = name._M_len;
  s_abi_cxx11_(__return_storage_ptr__,"Error: Player \"",0xf);
  std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)__return_storage_ptr__,&name_local);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,"\" not found.");
  return __return_storage_ptr__;
}

Assistant:

std::string player_not_found_message(std::string_view name) {
	std::string result = "Error: Player \""s;
	result += name;
	result += "\" not found.";
	return result;
}